

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlOutputBufferWrite(xmlOutputBufferPtr out,int len,char *buf)

{
  xmlOutputWriteCallback p_Var1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  xmlBufPtr pxVar5;
  size_t sVar6;
  xmlChar *pxVar7;
  xmlBufPtr *ppxVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  
  if ((out == (xmlOutputBufferPtr)0x0) || (out->error != 0)) {
LAB_0019a0b8:
    iVar10 = -1;
  }
  else if (len < 0) {
    iVar10 = 0;
  }
  else {
    iVar10 = 0;
    do {
      uVar11 = 16000;
      if (len < 16000) {
        uVar11 = (ulong)(uint)len;
      }
      iVar9 = (int)uVar11;
      if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        iVar3 = xmlBufAdd(out->buffer,(xmlChar *)buf,iVar9);
        if (iVar3 != 0) goto LAB_0019a0b8;
        iVar3 = iVar9;
        if (out->writecallback != (xmlOutputWriteCallback)0x0) {
          pxVar5 = out->buffer;
LAB_0019a1a3:
          sVar6 = xmlBufUse(pxVar5);
          iVar3 = (int)sVar6;
        }
      }
      else {
        if (out->conv == (xmlBufPtr)0x0) {
          pxVar5 = xmlBufCreate();
          out->conv = pxVar5;
        }
        iVar3 = xmlBufAdd(out->buffer,(xmlChar *)buf,iVar9);
        if (iVar3 != 0) goto LAB_0019a0b8;
        sVar6 = xmlBufUse(out->buffer);
        if (sVar6 < 4000 && len < 0x3e81) {
          return iVar10;
        }
        iVar3 = xmlCharEncOutput(out,0);
        if (iVar3 != -3 && iVar3 < 0) {
          iVar10 = 0x608;
          __xmlSimpleError(8,0x608,(xmlNodePtr)0x0,"encoder error",(char *)0x0);
          uVar4 = 0xffffffff;
          goto LAB_0019a2d7;
        }
        if (out->writecallback != (xmlOutputWriteCallback)0x0) {
          pxVar5 = out->conv;
          goto LAB_0019a1a3;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
      }
      len = len - iVar9;
      p_Var1 = out->writecallback;
      if (p_Var1 != (xmlOutputWriteCallback)0x0) {
        if (iVar3 < 4000 && len < 1) {
          return iVar10;
        }
        pvVar2 = out->context;
        if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
          pxVar7 = xmlBufContent(out->buffer);
          uVar4 = (*p_Var1)(pvVar2,(char *)pxVar7,iVar3);
          ppxVar8 = &out->buffer;
        }
        else {
          pxVar7 = xmlBufContent(out->conv);
          uVar4 = (*p_Var1)(pvVar2,(char *)pxVar7,iVar3);
          ppxVar8 = &out->conv;
        }
        if ((int)uVar4 < 0) {
          iVar10 = 0x60a;
          __xmlSimpleError(8,0x60a,(xmlNodePtr)0x0,"write error",(char *)0x0);
LAB_0019a2d7:
          out->error = iVar10;
          return uVar4;
        }
        xmlBufShrink(*ppxVar8,(ulong)uVar4);
        iVar9 = out->written + uVar4;
        if ((int)(uVar4 ^ 0x7fffffff) < out->written) {
          iVar9 = 0x7fffffff;
        }
        out->written = iVar9;
      }
      buf = (char *)((xmlChar *)buf + uVar11);
      iVar10 = iVar10 + iVar3;
    } while (0 < len);
  }
  return iVar10;
}

Assistant:

int
xmlOutputBufferWrite(xmlOutputBufferPtr out, int len, const char *buf) {
    int nbchars = 0; /* number of chars to output to I/O */
    int ret;         /* return from function call */
    int written = 0; /* number of char written to I/O so far */
    int chunk;       /* number of byte current processed from buf */

    if ((out == NULL) || (out->error)) return(-1);
    if (len < 0) return(0);
    if (out->error) return(-1);

    do {
	chunk = len;
	if (chunk > 4 * MINLEN)
	    chunk = 4 * MINLEN;

	/*
	 * first handle encoding stuff.
	 */
	if (out->encoder != NULL) {
	    /*
	     * Store the data in the incoming raw buffer
	     */
	    if (out->conv == NULL) {
		out->conv = xmlBufCreate();
	    }
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);

	    if ((xmlBufUse(out->buffer) < MINLEN) && (chunk == len))
		goto done;

	    /*
	     * convert as much as possible to the parser reading buffer.
	     */
	    ret = xmlCharEncOutput(out, 0);
	    if ((ret < 0) && (ret != -3)) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
            if (out->writecallback)
	        nbchars = xmlBufUse(out->conv);
            else
                nbchars = ret >= 0 ? ret : 0;
	} else {
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);
            if (out->writecallback)
	        nbchars = xmlBufUse(out->buffer);
            else
                nbchars = chunk;
	}
	buf += chunk;
	len -= chunk;

	if (out->writecallback) {
            if ((nbchars < MINLEN) && (len <= 0))
                goto done;

	    /*
	     * second write the stuff to the I/O channel
	     */
	    if (out->encoder != NULL) {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->conv), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->conv, ret);
	    } else {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->buffer), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->buffer, ret);
	    }
	    if (ret < 0) {
		xmlIOErr(XML_IO_WRITE, NULL);
		out->error = XML_IO_WRITE;
		return(ret);
	    }
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
	}
	written += nbchars;
    } while (len > 0);

done:
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: wrote %d chars\n", written);
#endif
    return(written);
}